

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::Write_ROM(GB *this,u16 addr,u8 val)

{
  uchar *puVar1;
  byte bVar2;
  sbyte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  u8 hi_bank;
  u8 sram_bank;
  u8 rom1_bank;
  u8 rom0_bank;
  u8 val_local;
  u16 addr_local;
  GB *this_local;
  
  switch(addr >> 0xc) {
  case 0:
  case 1:
    (this->s).sram_enabled = (val & 0xf) == 10;
    break;
  case 2:
    (this->s).mbc_2xxx = val;
    (this->s).mbc_23xxx = val;
    break;
  case 3:
    (this->s).mbc_3xxx = val;
    (this->s).mbc_23xxx = val;
    break;
  case 4:
  case 5:
    (this->s).mbc_45xxx = val;
    break;
  case 6:
  case 7:
    (this->s).mbc_mode = val;
  }
  local_14 = 0;
  local_15 = 1;
  local_16 = 0;
  switch((this->cart).mbc) {
  case _1:
    local_17 = 0x1f;
    local_18 = 5;
    goto LAB_00112278;
  case _1M:
    local_17 = 0xf;
    local_18 = 4;
LAB_00112278:
    bVar2 = (byte)(((this->s).mbc_45xxx & 3) << local_18);
    if ((this->s).mbc_mode != '\0') {
      local_16 = (this->s).mbc_45xxx & 3;
      local_14 = bVar2;
    }
    local_15 = (this->s).mbc_23xxx & local_17;
    if (local_15 == 0) {
      local_15 = 1;
    }
    local_15 = local_15 | bVar2;
    break;
  case _2:
    local_15 = (this->s).mbc_23xxx & 0xf;
    break;
  case _3:
    local_15 = (this->s).mbc_23xxx & 0x7f;
    local_16 = (this->s).mbc_45xxx & 7;
    break;
  case _5:
    local_15 = (this->s).mbc_2xxx;
    local_16 = (this->s).mbc_45xxx & 0xf;
    break;
  case MMM01:
    break;
  default:
    break;
  case HUC1:
    local_15 = (this->s).mbc_23xxx & 0x3f;
    if (local_15 == 0) {
      local_15 = 1;
    }
    if ((this->s).mbc_mode == '\0') {
      local_15 = local_15 | (this->s).mbc_45xxx << 6;
    }
    else {
      local_16 = (this->s).mbc_45xxx;
    }
  }
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom);
  (this->s).rom0p = puVar1 + (int)((uint)(local_14 & (this->cart).rom_bank_mask) << 0xe);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom);
  (this->s).rom1p = puVar1 + (int)((uint)(local_15 & (this->cart).rom_bank_mask) << 0xe);
  (this->s).sramp = (this->s).sram + (int)((uint)(local_16 & (this->cart).sram_bank_mask) << 0xd);
  return;
}

Assistant:

void GB::Write_ROM(u16 addr, u8 val) {
  switch (addr >> 12) {
    case 0: case 1: s.sram_enabled = (val & 0xf) == 0xa; break;
    case 2: s.mbc_2xxx = val; s.mbc_23xxx = val; break;
    case 3: s.mbc_3xxx = val; s.mbc_23xxx = val; break;
    case 4: case 5: s.mbc_45xxx = val; break;
    case 6: case 7: s.mbc_mode = val; break;
  }

  u8 rom0_bank = 0, rom1_bank = 1, sram_bank = 0;
  switch (cart.mbc) {
    {
      u8 mask, shift;
      case MBC::_1: mask = 0x1f; shift = 5; goto mbc1_shared;
      case MBC::_1M: mask = 0xf; shift = 4; goto mbc1_shared;
      mbc1_shared:
        u8 hi_bank = (s.mbc_45xxx & 3) << shift;
        if (s.mbc_mode) {
          rom0_bank |= hi_bank;
          sram_bank = (s.mbc_45xxx & 3);
        }
        rom1_bank = s.mbc_23xxx & mask;
        if (rom1_bank == 0) {
          ++rom1_bank;
        }
        rom1_bank |= hi_bank;
        break;
    }
    case MBC::_2:
      rom1_bank = s.mbc_23xxx & 0xf;
      break;
    case MBC::_3:
      rom1_bank = s.mbc_23xxx & 0x7f;
      sram_bank = s.mbc_45xxx & 0x7;
      break;
    case MBC::_5:
      rom1_bank = ((s.mbc_3xxx & 1) << 8) | s.mbc_2xxx;
      sram_bank = s.mbc_45xxx & 0xf;
      break;
    case MBC::HUC1: {
      rom1_bank = s.mbc_23xxx & 0x3f;
      if (rom1_bank == 0) { rom1_bank++; }
      if (s.mbc_mode) {
        sram_bank = s.mbc_45xxx;
      } else {
        rom1_bank |= (s.mbc_45xxx & 3) << 6;
      }
      break;
    }
    case MBC::MMM01: break;  // TODO
    default: break;
  }
  s.rom0p = rom.data() + ((rom0_bank & cart.rom_bank_mask) << 14);
  s.rom1p = rom.data() + ((rom1_bank & cart.rom_bank_mask) << 14);
  s.sramp = s.sram + ((sram_bank & cart.sram_bank_mask) << 13);
}